

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

void set_term_code(char *buf,quarter quarter,unsigned_short year)

{
  char local_17;
  char quarter_letter;
  unsigned_short year_local;
  quarter quarter_local;
  char *buf_local;
  
  switch(quarter) {
  case FALL_QUARTER:
    local_17 = 'F';
    break;
  case WINTER_QUARTER:
    local_17 = 'W';
    break;
  case SPRING_QUARTER:
    local_17 = 'S';
    break;
  case SUMMER_QUARTER:
    local_17 = 'U';
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BradleyCai[P]libucrcourse/src/params.c"
                  ,0x25,"void set_term_code(char *, enum quarter, unsigned short)");
  }
  sprintf(buf,"%02u%c",(ulong)year % 100,(ulong)(uint)(int)local_17);
  return;
}

Assistant:

static void set_term_code(char *buf, enum quarter quarter, unsigned short year)
{
	char quarter_letter;

	switch (quarter) {
	case FALL_QUARTER:
		quarter_letter = 'F';
		break;
	case WINTER_QUARTER:
		quarter_letter = 'W';
		break;
	case SPRING_QUARTER:
		quarter_letter = 'S';
		break;
	case SUMMER_QUARTER:
		quarter_letter = 'U';
		break;
	default:
		assert(0);
	}

	sprintf(buf, "%02u%c", year % 100u, quarter_letter);
}